

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O3

void __thiscall xray_re::xr_sound_env_object::save_v12(xr_sound_env_object *this,xr_ini_writer *w)

{
  pointer pcVar1;
  size_t __n;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  xr_custom_object::save_v12((xr_custom_object *)this,w);
  pcVar1 = (this->m_inner)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_inner)._M_string_length);
  xr_ini_writer::write(w,0x1f3701,(string *)local_40,0);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pcVar1 = (this->m_outer)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (this->m_outer)._M_string_length);
  __n = 0;
  xr_ini_writer::write(w,0x1f370b,(string *)local_60,0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  xr_ini_writer::write(w,0x1f4f3d,(void *)0x12,__n);
  return;
}

Assistant:

void xr_sound_env_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("env_inner", m_inner, false);
	w->write("env_outer", m_outer, false);

	w->write("version", SOUNDENV_VERSION);
}